

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

void mcode_allocarea(jit_State *J)

{
  undefined8 uVar1;
  ulong uVar2;
  void *pvVar3;
  long in_RDI;
  size_t sz;
  MCode *oldarea;
  size_t in_stack_00000018;
  jit_State *in_stack_00000020;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x970);
  uVar2 = (long)*(int *)(in_RDI + 0x628) * 0x400 + 0xfffU & 0xfffffffffffff000;
  pvVar3 = mcode_alloc(in_stack_00000020,in_stack_00000018);
  *(void **)(in_RDI + 0x970) = pvVar3;
  *(ulong *)(in_RDI + 0x988) = uVar2;
  *(undefined4 *)(in_RDI + 0x96c) = 3;
  *(long *)(in_RDI + 0x978) = *(long *)(in_RDI + 0x970) + *(long *)(in_RDI + 0x988);
  *(long *)(in_RDI + 0x980) = *(long *)(in_RDI + 0x970) + 0x10;
  **(undefined8 **)(in_RDI + 0x970) = uVar1;
  *(ulong *)(*(long *)(in_RDI + 0x970) + 8) = uVar2;
  *(ulong *)(in_RDI + 0x990) = uVar2 + *(long *)(in_RDI + 0x990);
  return;
}

Assistant:

static void mcode_allocarea(jit_State *J)
{
  MCode *oldarea = J->mcarea;
  size_t sz = (size_t)J->param[JIT_P_sizemcode] << 10;
  sz = (sz + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  J->mcarea = (MCode *)mcode_alloc(J, sz);
  J->szmcarea = sz;
  J->mcprot = MCPROT_GEN;
  J->mctop = (MCode *)((char *)J->mcarea + J->szmcarea);
  J->mcbot = (MCode *)((char *)J->mcarea + sizeof(MCLink));
  ((MCLink *)J->mcarea)->next = oldarea;
  ((MCLink *)J->mcarea)->size = sz;
  J->szallmcarea += sz;
}